

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_190fc3f::ExpressionParser::~ExpressionParser(ExpressionParser *this)

{
  ExpressionParser *this_local;
  
  cmsys::RegularExpression::~RegularExpression(&this->RegistryFormat);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ExpressionParser(cm::string_view expression)
    : Expression(expression)
    , Separator(";"_s)
    , RegistryFormat{
      "\\[({.+})?(HKCU|HKEY_CURRENT_USER|HKLM|HKEY_LOCAL_MACHINE|HKCR|HKEY_"
      "CLASSES_"
      "ROOT|HKCC|HKEY_CURRENT_CONFIG|HKU|HKEY_USERS)[/\\]?([^]]*)\\]"
    }
  {
  }